

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O0

void Abc_SclDeptFanin(SC_Man *p,SC_Timing *pTime,Abc_Obj_t *pObj,Abc_Obj_t *pFanin)

{
  SC_Pair *pDepIn_00;
  SC_Pair *pSlewIn_00;
  SC_Pair *pLoad_00;
  SC_Pair *pDepOut_00;
  SC_Pair *pDepOut;
  SC_Pair *pLoad;
  SC_Pair *pSlewIn;
  SC_Pair *pDepIn;
  Abc_Obj_t *pFanin_local;
  Abc_Obj_t *pObj_local;
  SC_Timing *pTime_local;
  SC_Man *p_local;
  
  pDepIn_00 = Abc_SclObjDept(p,pFanin);
  pSlewIn_00 = Abc_SclObjSlew(p,pFanin);
  pLoad_00 = Abc_SclObjLoad(p,pObj);
  pDepOut_00 = Abc_SclObjDept(p,pObj);
  Scl_LibPinDeparture(pTime,pDepIn_00,pSlewIn_00,pLoad_00,pDepOut_00);
  return;
}

Assistant:

static inline void Abc_SclDeptFanin( SC_Man * p, SC_Timing * pTime, Abc_Obj_t * pObj, Abc_Obj_t * pFanin )
{
    SC_Pair * pDepIn   = Abc_SclObjDept( p, pFanin );   // modified
    SC_Pair * pSlewIn  = Abc_SclObjSlew( p, pFanin );
    SC_Pair * pLoad    = Abc_SclObjLoad( p, pObj );
    SC_Pair * pDepOut  = Abc_SclObjDept( p, pObj );
    Scl_LibPinDeparture( pTime, pDepIn, pSlewIn, pLoad, pDepOut );
}